

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestMeasurementXMLParser.cxx
# Opt level: O2

void __thiscall
cmCTestTestMeasurementXMLParser::StartElement
          (cmCTestTestMeasurementXMLParser *this,string *name,char **attributes)

{
  char *__s1;
  int iVar1;
  char **ppcVar2;
  string *psVar3;
  
  (this->CharacterData)._M_string_length = 0;
  *(this->CharacterData)._M_dataplus._M_p = '\0';
  std::__cxx11::string::_M_assign((string *)&this->ElementName);
  ppcVar2 = attributes + 1;
  do {
    __s1 = ppcVar2[-1];
    if (__s1 == (char *)0x0) {
      return;
    }
    iVar1 = strcmp(__s1,"name");
    psVar3 = &this->MeasurementName;
    if (iVar1 == 0) {
LAB_001b11e4:
      std::__cxx11::string::assign((char *)psVar3);
    }
    else {
      iVar1 = strcmp(__s1,"type");
      psVar3 = &this->MeasurementType;
      if (iVar1 == 0) goto LAB_001b11e4;
    }
    ppcVar2 = ppcVar2 + 2;
  } while( true );
}

Assistant:

void cmCTestTestMeasurementXMLParser::StartElement(const std::string& name,
                                                   const char** attributes)
{
  this->CharacterData.clear();
  this->ElementName = name;
  for (const char** attr = attributes; *attr; attr += 2) {
    if (strcmp(attr[0], "name") == 0) {
      this->MeasurementName = attr[1];
    } else if (strcmp(attr[0], "type") == 0) {
      this->MeasurementType = attr[1];
    }
  }
}